

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# do_wear.c
# Opt level: O0

int cursed(obj *otmp)

{
  uint uVar1;
  char *pcVar2;
  bool bVar3;
  obj *otmp_local;
  
  if (otmp == uwep) {
    uVar1 = welded(otmp);
  }
  else {
    uVar1 = *(uint *)&otmp->field_0x4a & 1;
  }
  if (uVar1 == 0) {
    otmp_local._4_4_ = 0;
  }
  else {
    bVar3 = true;
    if ((((otmp->quan < 2) && (bVar3 = true, otmp->oartifact != '\x1d')) &&
        (bVar3 = true, otmp->otyp != 0xed)) &&
       (((otmp->oclass != '\x03' || (bVar3 = true, objects[otmp->otyp].oc_subtyp != '\x04')) &&
        (bVar3 = false, otmp->oclass == '\x03')))) {
      bVar3 = objects[otmp->otyp].oc_subtyp == '\x03';
    }
    pcVar2 = "It is";
    if (bVar3) {
      pcVar2 = "They are";
    }
    pline("You can\'t.  %s cursed.",pcVar2);
    *(uint *)&otmp->field_0x4a = *(uint *)&otmp->field_0x4a & 0xffffffbf | 0x40;
    otmp_local._4_4_ = 1;
  }
  return otmp_local._4_4_;
}

Assistant:

int cursed(struct obj *otmp)
{
	/* Curses, like chickens, come home to roost. */
	if ((otmp == uwep) ? welded(otmp) : (int)otmp->cursed) {
		pline("You can't.  %s cursed.",
			(is_plural(otmp) || otmp->otyp == LENSES ||
			 is_boots(otmp) || is_gloves(otmp)) ?
			"They are" : "It is");
		otmp->bknown = TRUE;
		return 1;
	}
	return 0;
}